

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O0

Fl_Type * __thiscall
Fl_Input_Choice_Type::click_test(Fl_Input_Choice_Type *this,int param_1,int param_2)

{
  Fl_Menu_ *this_00;
  Fl_Menu_Item *m_00;
  Fl_Menu_Item *this_01;
  Fl_Menu_Item *m;
  Fl_Menu_Item *save;
  Fl_Menu_ *w;
  int param_2_local;
  int param_1_local;
  Fl_Input_Choice_Type *this_local;
  
  if ((this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type.selected == '\0') {
    this_00 = &Fl_Input_Choice::menubutton
                         ((Fl_Input_Choice *)(this->super_Fl_Menu_Type).super_Fl_Widget_Type.o)->
               super_Fl_Menu_;
    if ((this->super_Fl_Menu_Type).menusize == 0) {
      this_local = (Fl_Input_Choice_Type *)0x0;
    }
    else {
      m_00 = Fl_Menu_::mvalue(this_00);
      Fl_Menu_::value(this_00,(Fl_Menu_Item *)0x0);
      Fl::pushed(&this_00->super_Fl_Widget);
      (*(this_00->super_Fl_Widget)._vptr_Fl_Widget[3])(this_00,1);
      this_01 = Fl_Menu_::mvalue(this_00);
      if (this_01 == (Fl_Menu_Item *)0x0) {
        Fl_Menu_::value(this_00,m_00);
        this_local = this;
      }
      else {
        if ((this_01->flags & 10U) != 0) {
          (*(this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type._vptr_Fl_Type[0x2f])();
        }
        this_local = (Fl_Input_Choice_Type *)Fl_Menu_Item::user_data(this_01);
      }
    }
  }
  else {
    this_local = (Fl_Input_Choice_Type *)0x0;
  }
  return (Fl_Type *)this_local;
}

Assistant:

Fl_Type* Fl_Input_Choice_Type::click_test(int, int) {
  if (selected) return 0; // let user move the widget
  Fl_Menu_* w = ((Fl_Input_Choice*)o)->menubutton();
  if (!menusize) return 0;
  const Fl_Menu_Item* save = w->mvalue();
  w->value((Fl_Menu_Item*)0);
  Fl::pushed(w);
  w->handle(FL_PUSH);
  const Fl_Menu_Item* m = w->mvalue();
  if (m) {
    // restore the settings of toggles & radio items:
    if (m->flags & (FL_MENU_RADIO | FL_MENU_TOGGLE)) build_menu();
    return (Fl_Type*)(m->user_data());
  }
  w->value(save);
  return this;
}